

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

void __thiscall
nlohmann::
basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
::basic_json(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
             *this,initializer_list<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>_>
                   init,bool type_deduction,value_t manual_type)

{
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator>>>>
  *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  bool bVar1;
  bool bVar2;
  size_type sVar3;
  const_reference pvVar4;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>_>_>_>
  *pmVar5;
  object_t *poVar6;
  domain_error *this_01;
  ushort uVar7;
  size_type sVar8;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
  *this_02;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
  *this_03;
  long lVar9;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
  *element;
  initializer_list<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>_>
  init_local;
  
  sVar8 = init._M_len;
  this_02 = init._M_array;
  (this->m_type).data = 0;
  (this->m_value).object = (object_t *)0x0;
  lVar9 = sVar8 << 4;
  this_03 = this_02;
  init_local._M_array = this_02;
  init_local._M_len = sVar8;
  while( true ) {
    if (lVar9 == 0) {
      bVar1 = true;
      goto LAB_00104bd8;
    }
    if ((((this_03->m_type).data & 0xf) != 2) || (sVar3 = size(this_03), sVar3 != 2)) break;
    bVar1 = false;
    pvVar4 = operator[](this_03,0);
    this_03 = this_03 + 1;
    lVar9 = lVar9 + -0x10;
    if (((pvVar4->m_type).data & 0xf) != 3) {
LAB_00104bd8:
      bVar2 = bVar1;
      if (!type_deduction) {
        if (manual_type == array) {
          bVar2 = false;
        }
        if ((manual_type == object) && (!bVar1)) {
          this_01 = (domain_error *)__cxa_allocate_exception(0x10);
          std::domain_error::domain_error(this_01,"cannot create object from initializer list");
          __cxa_throw(this_01,&std::domain_error::typeinfo,std::domain_error::~domain_error);
        }
      }
      uVar7 = (this->m_type).data & 0xfff0;
      if (bVar2) {
        (this->m_type).data = uVar7 | 1;
        pmVar5 = basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator>
                 ::
                 create<std::map<std::__cxx11::string,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator>>>>>
                           ();
        (this->m_value).object = pmVar5;
        if (pmVar5 == (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>_>_>_>
                       *)0x0) {
          __assert_fail("m_value.object != nullptr",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/alican[P]GeneticAlgorithm/algorithm/../lib/json.hpp"
                        ,0x67c,
                        "nlohmann::basic_json<>::basic_json(std::initializer_list<basic_json<ObjectType, ArrayType, StringType, BooleanType, NumberIntegerType, NumberUnsignedType, NumberFloatType, AllocatorType>>, bool, value_t) [ObjectType = std::map, ArrayType = std::vector, StringType = std::basic_string<char>, BooleanType = bool, NumberIntegerType = long, NumberUnsignedType = unsigned long, NumberFloatType = double, AllocatorType = std::allocator]"
                       );
        }
        for (lVar9 = sVar8 << 4; lVar9 != 0; lVar9 = lVar9 + -0x10) {
          this_00 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator>>>>
                     *)(this->m_value).object;
          pvVar4 = operator[](this_02,0);
          __args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (pvVar4->m_value).object;
          pvVar4 = operator[](this_02,1);
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator>>>>
          ::
          _M_emplace_unique<std::__cxx11::string&,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator>const&>
                    (this_00,__args,pvVar4);
          this_02 = this_02 + 1;
        }
      }
      else {
        (this->m_type).data = uVar7 | 2;
        poVar6 = (object_t *)
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator>
                 ::
                 create<std::vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator>>>,std::initializer_list<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator>>&>
                           (&init_local);
        (this->m_value).object = poVar6;
      }
      return;
    }
  }
  bVar1 = false;
  goto LAB_00104bd8;
}

Assistant:

basic_json(std::initializer_list<basic_json> init,
                   bool type_deduction = true,
                   value_t manual_type = value_t::array)
        {
            // the initializer list could describe an object
            bool is_an_object = true;

            // check if each element is an array with two elements whose first
            // element is a string
            for (const auto& element : init)
            {
                if (not element.is_array() or element.size() != 2
                    or not element[0].is_string())
                {
                    // we found an element that makes it impossible to use the
                    // initializer list as object
                    is_an_object = false;
                    break;
                }
            }

            // adjust type if type deduction is not wanted
            if (not type_deduction)
            {
                // if array is wanted, do not create an object though possible
                if (manual_type == value_t::array)
                {
                    is_an_object = false;
                }

                // if object is wanted but impossible, throw an exception
                if (manual_type == value_t::object and not is_an_object)
                {
                    throw std::domain_error("cannot create object from initializer list");
                }
            }

            if (is_an_object)
            {
                // the initializer list is a list of pairs -> create object
                m_type = value_t::object;
                m_value = value_t::object;

                assert(m_value.object != nullptr);

                for (auto& element : init)
                {
                    m_value.object->emplace(*(element[0].m_value.string), element[1]);
                }
            }
            else
            {
                // the initializer list describes an array -> create array
                m_type = value_t::array;
                m_value.array = create<array_t>(init);
            }
        }